

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O0

void secp256k1_modinv64_var(secp256k1_modinv64_signed62 *x,secp256k1_modinv64_modinfo *modinfo)

{
  long lVar1;
  ulong uVar2;
  secp256k1_modinv64_modinfo *in_RSI;
  void *in_RDI;
  secp256k1_modinv64_trans2x2 t;
  int64_t gn;
  int64_t fn;
  int64_t cond;
  int64_t eta;
  int len;
  int j;
  secp256k1_modinv64_signed62 g;
  secp256k1_modinv64_signed62 f;
  secp256k1_modinv64_signed62 e;
  secp256k1_modinv64_signed62 d;
  ulong local_c8;
  int local_b8;
  int local_b4;
  ulong local_b0;
  secp256k1_modinv64_trans2x2 *in_stack_ffffffffffffff58;
  uint64_t in_stack_ffffffffffffff60;
  secp256k1_modinv64_trans2x2 *in_stack_ffffffffffffff68;
  secp256k1_modinv64_signed62 *in_stack_ffffffffffffff70;
  secp256k1_modinv64_signed62 *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff84;
  undefined8 local_60 [5];
  secp256k1_modinv64_modinfo *in_stack_ffffffffffffffc8;
  secp256k1_modinv64_trans2x2 *in_stack_ffffffffffffffd0;
  secp256k1_modinv64_signed62 *in_stack_ffffffffffffffd8;
  secp256k1_modinv64_signed62 *in_stack_ffffffffffffffe0;
  
  memset(&stack0xffffffffffffffc8,0,0x28);
  memset(local_60,0,0x28);
  local_60[0] = 1;
  memcpy(&stack0xffffffffffffff78,in_RSI,0x28);
  memcpy(&local_b0,in_RDI,0x28);
  local_b8 = 5;
  do {
    secp256k1_modinv64_divsteps_62_var
              ((int64_t)in_stack_ffffffffffffff70,(uint64_t)in_stack_ffffffffffffff68,
               in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    secp256k1_modinv64_update_de_62
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffc8);
    secp256k1_modinv64_update_fg_62_var
              (in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68);
    if (local_b0 == 0) {
      local_c8 = 0;
      for (local_b4 = 1; local_b4 < local_b8; local_b4 = local_b4 + 1) {
        local_c8 = (&local_b0)[local_b4] | local_c8;
      }
      if (local_c8 == 0) {
        secp256k1_modinv64_normalize_62
                  ((secp256k1_modinv64_signed62 *)&stack0xffffffffffffffc8,
                   *(int64_t *)(&stack0xffffffffffffff78 + (long)(local_b8 + -1) * 8),in_RSI);
        memcpy(in_RDI,&stack0xffffffffffffffc8,0x28);
        return;
      }
    }
    lVar1 = *(long *)(&stack0xffffffffffffff78 + (long)(local_b8 + -1) * 8);
    uVar2 = (&local_b0)[local_b8 + -1];
    if (uVar2 == (long)uVar2 >> 0x3f && (lVar1 == lVar1 >> 0x3f && -1 < (long)local_b8 + -2)) {
      *(ulong *)(&stack0xffffffffffffff78 + (long)(local_b8 + -2) * 8) =
           lVar1 << 0x3e | *(ulong *)(&stack0xffffffffffffff78 + (long)(local_b8 + -2) * 8);
      (&local_b0)[local_b8 + -2] = uVar2 << 0x3e | (&local_b0)[local_b8 + -2];
      local_b8 = local_b8 + -1;
    }
  } while( true );
}

Assistant:

static void secp256k1_modinv64_var(secp256k1_modinv64_signed62 *x, const secp256k1_modinv64_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, eta=-1. */
    secp256k1_modinv64_signed62 d = {{0, 0, 0, 0, 0}};
    secp256k1_modinv64_signed62 e = {{1, 0, 0, 0, 0}};
    secp256k1_modinv64_signed62 f = modinfo->modulus;
    secp256k1_modinv64_signed62 g = *x;
#ifdef VERIFY
    int i = 0;
#endif
    int j, len = 5;
    int64_t eta = -1; /* eta = -delta; delta is initially 1 */
    int64_t cond, fn, gn;

    /* Do iterations of 62 divsteps each until g=0. */
    while (1) {
        /* Compute transition matrix and new eta after 62 divsteps. */
        secp256k1_modinv64_trans2x2 t;
        eta = secp256k1_modinv64_divsteps_62_var(eta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv64_update_de_62(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */

        secp256k1_modinv64_update_fg_62_var(len, &f, &g, &t);
        /* If the bottom limb of g is zero, there is a chance that g=0. */
        if (g.v[0] == 0) {
            cond = 0;
            /* Check if the other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= g.v[j];
            }
            /* If so, we're done. */
            if (cond == 0) break;
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0 or -1. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int64_t)len - 2) >> 63;
        cond |= fn ^ (fn >> 63);
        cond |= gn ^ (gn >> 63);
        /* If so, reduce length, propagating the sign of f and g's top limb into the one below. */
        if (cond == 0) {
            f.v[len - 2] |= (uint64_t)fn << 62;
            g.v[len - 2] |= (uint64_t)gn << 62;
            --len;
        }

        VERIFY_CHECK(++i < 12); /* We should never need more than 12*62 = 744 divsteps */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */
    }

    /* At this point g is 0 and (if g was not originally 0) f must now equal +/- GCD of
     * the initial f, g values i.e. +/- 1, and d now contains +/- the modular inverse. */

    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &SECP256K1_SIGNED62_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and f == modulus) */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &SECP256K1_SIGNED62_ONE, -1) == 0 ||
                 secp256k1_modinv64_mul_cmp_62(&f, len, &SECP256K1_SIGNED62_ONE, 1) == 0 ||
                 (secp256k1_modinv64_mul_cmp_62(x, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 &&
                  secp256k1_modinv64_mul_cmp_62(&d, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 &&
                  secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) == 0));

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv64_normalize_62(&d, f.v[len - 1], modinfo);
    *x = d;
}